

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

bool __thiscall QJsonPrivate::Parser::parseMember(Parser *this)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  
  bVar2 = parseString(this);
  if (!bVar2) {
    return false;
  }
  pbVar3 = (byte *)this->json;
  pbVar1 = (byte *)this->end;
  if (pbVar3 < pbVar1) {
    bVar4 = *pbVar3;
    if ((char)bVar4 < '!') {
      bVar2 = true;
      while ((pbVar5 = pbVar3 + 1, bVar4 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar5;
        bVar2 = pbVar5 < pbVar1;
        pbVar3 = pbVar5;
        if ((pbVar5 == pbVar1) || (bVar4 = *pbVar5, ' ' < (char)bVar4)) break;
      }
      if (!bVar2) goto LAB_002f3738;
    }
    pbVar5 = pbVar3 + 1;
    this->json = (char *)pbVar5;
    if (*pbVar3 == 0x3a) {
      if (pbVar1 <= pbVar5) {
LAB_002f3743:
        this->lastError = UnterminatedObject;
        return false;
      }
      bVar4 = *pbVar5;
      if ((char)bVar4 < '!') {
        pbVar3 = pbVar3 + 2;
        bVar2 = true;
        do {
          if ((0x20 < bVar4) || ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) break;
          this->json = (char *)pbVar3;
          bVar2 = pbVar3 < pbVar1;
          if (pbVar3 == pbVar1) break;
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while ((char)bVar4 < '!');
        if (!bVar2) goto LAB_002f3743;
      }
      bVar2 = parseValueIntoContainer(this);
      return bVar2;
    }
  }
LAB_002f3738:
  this->lastError = MissingNameSeparator;
  return false;
}

Assistant:

bool Parser::parseMember()
{
    if (!parseString())
        return false;
    char token = nextToken();
    if (token != NameSeparator) {
        lastError = QJsonParseError::MissingNameSeparator;
        return false;
    }
    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    return parseValueIntoContainer();
}